

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O0

bool __thiscall MipsElfFile::setSection(MipsElfFile *this,string *name)

{
  int iVar1;
  ElfSegment *pEVar2;
  int n;
  int n_1;
  ElfSegment *seg;
  size_t i;
  string *name_local;
  MipsElfFile *this_local;
  
  seg = (ElfSegment *)0x0;
  while( true ) {
    pEVar2 = (ElfSegment *)ElfFile::getSegmentCount(&this->elf);
    if (pEVar2 <= seg) {
      iVar1 = ElfFile::findSegmentlessSection(&this->elf,name);
      if (iVar1 == -1) {
        Logger::queueError<std::__cxx11::string>
                  ((Logger *)0x0,0x22ae36,(char *)name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar2);
      }
      else {
        this->segment = -1;
        this->section = iVar1;
      }
      this_local._7_1_ = iVar1 != -1;
      return this_local._7_1_;
    }
    pEVar2 = ElfFile::getSegment(&this->elf,(size_t)seg);
    iVar1 = ElfSegment::findSection(pEVar2,name);
    if (iVar1 != -1) break;
    seg = (ElfSegment *)((long)&(seg->header).p_type + 1);
  }
  this->segment = (int)seg;
  this->section = iVar1;
  return true;
}

Assistant:

bool MipsElfFile::setSection(const std::string& name)
{
	// look in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int n = seg->findSection(name);
		if (n != -1)
		{
			segment = (int) i;
			section = n;
			return true;
		}
	}

	// look in stray sections
	int n = elf.findSegmentlessSection(name);
	if (n != -1)
	{
		segment = -1;
		section = n;
		return true;
	}

	Logger::queueError(Logger::Warning, "Section %s not found",name);
	return false;
}